

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O1

void __thiscall
wallet::DescribeWalletAddressVisitor::ProcessSubScript
          (DescribeWalletAddressVisitor *this,CScript *subscript,UniValue *obj)

{
  uint uVar1;
  CScript *pCVar2;
  pointer pcVar3;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  UniValue val;
  UniValue obj_00;
  UniValue obj_01;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  undefined8 uVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pUVar8;
  bool bVar9;
  TxoutType t;
  UniValue *pUVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions_data;
  size_t i;
  UniValue wallet_detail;
  UniValue detail;
  UniValue subobj;
  CTxDestination embedded;
  undefined8 in_stack_fffffffffffff918;
  pointer pvVar15;
  pointer pvVar16;
  pointer pvVar17;
  size_t in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  undefined8 in_stack_fffffffffffff950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined8 in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  undefined8 uVar19;
  undefined8 in_stack_fffffffffffff968;
  pointer in_stack_fffffffffffff970;
  pointer in_stack_fffffffffffff978;
  pointer in_stack_fffffffffffff980;
  pointer in_stack_fffffffffffff988;
  long *local_660 [2];
  long local_650 [2];
  UniValue local_640;
  undefined1 *local_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8 [9];
  undefined4 local_5cf;
  undefined2 local_5cb;
  char local_5c9;
  UniValue local_5c8;
  long *local_570 [2];
  long local_560 [2];
  VType local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  size_type local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_528;
  vector<UniValue,_std::allocator<UniValue>_> local_510;
  long *local_4f8 [2];
  long local_4e8 [2];
  VType local_4d8;
  long *local_4d0 [2];
  long local_4c0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  vector<UniValue,_std::allocator<UniValue>_> local_498;
  long *local_480 [2];
  long local_470 [2];
  UniValue local_460;
  long *local_408 [2];
  long local_3f8 [2];
  string local_3e8;
  UniValue local_3c8;
  long *local_370 [2];
  long local_360 [2];
  VType local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  vector<UniValue,_std::allocator<UniValue>_> local_310;
  undefined1 local_2f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  vector<UniValue,_std::allocator<UniValue>_> local_2b8;
  VType local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  vector<UniValue,_std::allocator<UniValue>_> local_260;
  UniValue local_248;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [9];
  undefined4 local_1d7;
  undefined2 local_1d3;
  char local_1d1;
  undefined1 local_1d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<UniValue,_std::allocator<UniValue>_> vStack_190;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_178;
  undefined1 local_130;
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  UniValue local_b0;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar15 = (pointer)0x0;
  pvVar16 = (pointer)0x0;
  pvVar17 = (pointer)0x0;
  t = Solver(subscript,
             (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&stack0xfffffffffffff928);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"script","");
  GetTxnOutputType_abi_cxx11_((string *)local_1d0,t);
  ::UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  key._M_string_length = (size_type)obj;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
  key.field_2._M_allocated_capacity = (size_type)pvVar15;
  key.field_2._8_8_ = pvVar16;
  val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
  val_00._0_8_ = pvVar17;
  val_00.val._M_string_length._0_4_ = in_stack_fffffffffffff948;
  val_00.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
  val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffff958;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff970;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff978;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff980;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff988;
  ::UniValue::pushKV(obj,key,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
    operator_delete(local_b0.val._M_dataplus._M_p,local_b0.val.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) != local_1d0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),local_1d0._16_8_ + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"hex","");
  uVar1 = (subscript->super_CScriptBase)._size;
  uVar11 = uVar1 - 0x1d;
  pCVar2 = (CScript *)(subscript->super_CScriptBase)._union.indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    uVar11 = uVar1;
    pCVar2 = subscript;
  }
  s.m_size._0_4_ = uVar11;
  s.m_data = (uchar *)pCVar2;
  s.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)local_1d0,s);
  ::UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  key_00._M_string_length = (size_type)obj;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
  key_00.field_2._M_allocated_capacity = (size_type)pvVar15;
  key_00.field_2._8_8_ = pvVar16;
  val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
  val_01._0_8_ = pvVar17;
  val_01.val._M_string_length._0_4_ = in_stack_fffffffffffff948;
  val_01.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
  val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffff958;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff970;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff978;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff980;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff988;
  ::UniValue::pushKV(obj,key_00,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
    operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_) != local_1d0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1d0._4_4_,local_1d0._0_4_),local_1d0._16_8_ + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_178._16_8_ = 0;
  local_178._24_8_ = 0;
  local_178._0_8_ = 0;
  local_178._8_8_ = 0;
  local_130 = 0;
  bVar9 = ExtractDestination(subscript,(CTxDestination *)&local_178._M_first);
  if (bVar9) {
    local_1f0 = local_1e0;
    local_1e8 = 0;
    local_1d0._8_8_ = &local_1b8;
    local_1d0._0_4_ = VOBJ;
    local_1b8._M_local_buf[0] = '\0';
    local_1b8._1_7_ = (undefined7)local_1e0._1_8_;
    local_1b8._M_local_buf[8] = SUB81(local_1e0._1_8_,7);
    local_1b8._9_4_ = local_1d7;
    local_1b8._13_2_ = local_1d3;
    local_1b8._M_local_buf[0xf] = local_1d1;
    local_1d0._16_8_ = 0;
    local_1e0[0] = 0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DescribeAddress(&local_248,(CTxDestination *)&local_178._M_first);
    paVar18 = &local_248.val.field_2;
    local_2a0 = local_248.typ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.val._M_dataplus._M_p == paVar18) {
      local_288._8_8_ = local_248.val.field_2._8_8_;
      local_298 = &local_288;
    }
    else {
      local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248.val._M_dataplus._M_p;
    }
    local_288._M_allocated_capacity._1_7_ = local_248.val.field_2._M_allocated_capacity._1_7_;
    local_288._M_local_buf[0] = local_248.val.field_2._M_local_buf[0];
    local_290 = local_248.val._M_string_length;
    local_248.val._M_string_length = 0;
    local_248.val.field_2._M_local_buf[0] = '\0';
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_248.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_248.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_248.keys.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_248.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_260.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_248.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_260.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_248.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_260.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_248.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_248.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    obj_00.val._M_dataplus._M_p = (pointer)obj;
    obj_00._0_8_ = in_stack_fffffffffffff918;
    obj_00.val._M_string_length = (size_type)pvVar15;
    obj_00.val.field_2._M_allocated_capacity = (size_type)pvVar16;
    obj_00.val.field_2._8_8_ = pvVar17;
    obj_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
    obj_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff948;
    obj_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff94c;
    obj_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
    obj_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
    obj_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
    obj_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff968;
    local_248.val._M_dataplus._M_p = (pointer)paVar18;
    ::UniValue::pushKVs((UniValue *)local_1d0,obj_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_260);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288._M_allocated_capacity + 1);
    }
    std::
    visit<wallet::DescribeWalletAddressVisitor_const&,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>&>
              ((__visit_result_t<const_wallet::DescribeWalletAddressVisitor_&,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
                *)local_2f8,this,
               (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)&local_178._M_first);
    local_350 = local_2f8._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._8_8_ == &local_2e0) {
      local_338._8_8_ = local_2e0._8_8_;
      local_348 = &local_338;
    }
    else {
      local_348 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._8_8_;
    }
    local_338._M_allocated_capacity._1_7_ = local_2e0._1_7_;
    local_338._M_local_buf[0] = local_2e0._M_local_buf[0];
    local_340 = local_2f8._16_8_;
    local_2f8._16_8_ = 0;
    local_2e0._M_local_buf[0] = '\0';
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2d0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2d0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2d0.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2d0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_310.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    obj_01.val._M_dataplus._M_p = (pointer)obj;
    obj_01._0_8_ = in_stack_fffffffffffff918;
    obj_01.val._M_string_length = (size_type)pvVar15;
    obj_01.val.field_2._M_allocated_capacity = (size_type)pvVar16;
    obj_01.val.field_2._8_8_ = pvVar17;
    obj_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
    obj_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff948;
    obj_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff94c;
    obj_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
    obj_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
    obj_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
    obj_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff968;
    local_2f8._8_8_ = &local_2e0;
    ::UniValue::pushKVs((UniValue *)local_1d0,obj_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_310);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328);
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338._M_allocated_capacity + 1);
    }
    local_370[0] = local_360;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"address","");
    EncodeDestination_abi_cxx11_(&local_3e8,(CTxDestination *)&local_178._M_first);
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3c8,&local_3e8);
    key_02._M_string_length = (size_type)obj;
    key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
    key_02.field_2._M_allocated_capacity = (size_type)pvVar15;
    key_02.field_2._8_8_ = pvVar16;
    val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
    val_03._0_8_ = pvVar17;
    val_03.val._M_string_length._0_4_ = in_stack_fffffffffffff948;
    val_03.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
    val_03.val.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
    val_03.val.field_2._8_8_ = in_stack_fffffffffffff958;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff970;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff978;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff980;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff988;
    ::UniValue::pushKV((UniValue *)local_1d0,key_02,val_03);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3c8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3c8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.val._M_dataplus._M_p != &local_3c8.val.field_2) {
      operator_delete(local_3c8.val._M_dataplus._M_p,local_3c8.val.field_2._M_allocated_capacity + 1
                     );
    }
    paVar18 = &local_3e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar18) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if (local_370[0] != local_360) {
      operator_delete(local_370[0],local_360[0] + 1);
    }
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"scriptPubKey","");
    uVar1 = (subscript->super_CScriptBase)._size;
    uVar11 = uVar1 - 0x1d;
    pCVar2 = (CScript *)(subscript->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar11 = uVar1;
      pCVar2 = subscript;
    }
    s_01.m_size._0_4_ = uVar11;
    s_01.m_data = (uchar *)pCVar2;
    s_01.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_3e8,s_01);
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_460,&local_3e8);
    key_03._M_string_length = (size_type)obj;
    key_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
    key_03.field_2._M_allocated_capacity = (size_type)pvVar15;
    key_03.field_2._8_8_ = pvVar16;
    val_04.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
    val_04._0_8_ = pvVar17;
    val_04.val._M_string_length._0_4_ = in_stack_fffffffffffff948;
    val_04.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
    val_04.val.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
    val_04.val.field_2._8_8_ = in_stack_fffffffffffff958;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff970;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff978;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff980;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff988;
    ::UniValue::pushKV((UniValue *)local_1d0,key_03,val_04);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_460.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_460.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460.val._M_dataplus._M_p != &local_460.val.field_2) {
      operator_delete(local_460.val._M_dataplus._M_p,local_460.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar18) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if (local_408[0] != local_3f8) {
      operator_delete(local_408[0],local_3f8[0] + 1);
    }
    local_3e8._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"pubkey","");
    bVar9 = ::UniValue::findKey((UniValue *)local_1d0,&local_3e8,(size_t *)&stack0xfffffffffffff940)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar18) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if (bVar9) {
      local_480[0] = local_470;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"pubkey","");
      local_3e8._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"pubkey","");
      pUVar10 = ::UniValue::operator[]((UniValue *)local_1d0,&local_3e8);
      local_4d8 = pUVar10->typ;
      pcVar3 = (pUVar10->val)._M_dataplus._M_p;
      local_4d0[0] = local_4c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4d0,pcVar3,pcVar3 + (pUVar10->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4b0,&pUVar10->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_498,&pUVar10->values);
      key_04._M_string_length = (size_type)obj;
      key_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
      key_04.field_2._M_allocated_capacity = (size_type)pvVar15;
      key_04.field_2._8_8_ = pvVar16;
      val_05.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
      val_05._0_8_ = pvVar17;
      val_05.val._M_string_length._0_4_ = in_stack_fffffffffffff948;
      val_05.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
      val_05.val.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
      val_05.val.field_2._8_8_ = in_stack_fffffffffffff958;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff970;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff978;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff980;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff988;
      ::UniValue::pushKV(obj,key_04,val_05);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4b0);
      if (local_4d0[0] != local_4c0) {
        operator_delete(local_4d0[0],local_4c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != paVar18) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if (local_480[0] != local_470) {
        operator_delete(local_480[0],local_470[0] + 1);
      }
    }
    local_4f8[0] = local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"embedded","");
    local_550 = local_1d0._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._8_8_ == &local_1b8) {
      local_538._8_8_ =
           CONCAT17(local_1b8._M_local_buf[0xf],
                    CONCAT25(local_1b8._13_2_,CONCAT41(local_1b8._9_4_,local_1b8._M_local_buf[8])));
      local_548 = &local_538;
    }
    else {
      local_548 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._8_8_;
    }
    local_538._M_allocated_capacity._1_7_ = local_1b8._1_7_;
    local_538._M_local_buf[0] = local_1b8._M_local_buf[0];
    local_540 = local_1d0._16_8_;
    local_1d0._16_8_ = 0;
    local_1b8._M_local_buf[0] = '\0';
    local_528.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_528.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_528.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_510.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_510.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_510.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key_05._M_string_length = (size_type)obj;
    key_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
    key_05.field_2._M_allocated_capacity = (size_type)pvVar15;
    key_05.field_2._8_8_ = pvVar16;
    val_06.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
    val_06._0_8_ = pvVar17;
    val_06.val._M_string_length._0_4_ = in_stack_fffffffffffff948;
    val_06.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
    val_06.val.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
    val_06.val.field_2._8_8_ = in_stack_fffffffffffff958;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff970;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff978;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff980;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff988;
    local_1d0._8_8_ = &local_1b8;
    ::UniValue::pushKV(obj,key_05,val_06);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_510);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_528);
    if (local_548 != &local_538) {
      operator_delete(local_548,local_538._M_allocated_capacity + 1);
    }
    if (local_4f8[0] != local_4e8) {
      operator_delete(local_4f8[0],local_4e8[0] + 1);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._8_8_ != &local_2e0) {
      operator_delete((void *)local_2f8._8_8_,
                      CONCAT71(local_2e0._1_7_,local_2e0._M_local_buf[0]) + 1);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_248.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248.val._M_dataplus._M_p != &local_248.val.field_2) {
      operator_delete(local_248.val._M_dataplus._M_p,
                      CONCAT71(local_248.val.field_2._M_allocated_capacity._1_7_,
                               local_248.val.field_2._M_local_buf[0]) + 1);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_190);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._8_8_ == &local_1b8) goto LAB_0058ddf0;
  }
  else {
    if (t != MULTISIG) goto LAB_0058ddf0;
    local_570[0] = local_560;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"sigsrequired","");
    ::UniValue::UniValue<unsigned_char_&,_unsigned_char,_true>
              (&local_5c8,
               (pvVar15->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start);
    key_01._M_string_length = (size_type)obj;
    key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
    key_01.field_2._M_allocated_capacity = (size_type)pvVar15;
    key_01.field_2._8_8_ = pvVar16;
    val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
    val_02._0_8_ = pvVar17;
    val_02.val._M_string_length._0_4_ = in_stack_fffffffffffff948;
    val_02.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
    val_02.val.field_2._M_allocated_capacity = in_stack_fffffffffffff950;
    val_02.val.field_2._8_8_ = in_stack_fffffffffffff958;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff960;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff970;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff978;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff980;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff988;
    ::UniValue::pushKV(obj,key_01,val_02);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5c8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5c8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8.val._M_dataplus._M_p != &local_5c8.val.field_2) {
      operator_delete(local_5c8.val._M_dataplus._M_p,local_5c8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_570[0] != local_560) {
      operator_delete(local_570[0],local_560[0] + 1);
    }
    local_5e8 = local_5d8;
    local_5e0 = 0;
    local_1d0._8_8_ = &local_1b8;
    local_1d0._0_4_ = VARR;
    local_1b8._M_local_buf[0] = '\0';
    local_1b8._1_7_ = (undefined7)local_5d8._1_8_;
    local_1b8._M_local_buf[8] = SUB81(local_5d8._1_8_,7);
    local_1b8._9_4_ = local_5cf;
    local_1b8._13_2_ = local_5cb;
    local_1b8._M_local_buf[0xf] = local_5c9;
    local_1d0._16_8_ = 0;
    local_5d8[0] = 0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((long)pvVar16 - (long)pvVar15 >> 3) * -0x5555555555555555 - 3U < 0xfffffffffffffffe) {
      uVar14 = 1;
      lVar13 = 0x20;
      do {
        CPubKey::
        Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((CPubKey *)&local_248,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)((long)pvVar15 + lVar13 + -8),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)
                      ((long)&(pvVar15->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar13));
        sVar12 = 0x21;
        if (((undefined1)local_248.typ & 0xfe) != VARR) {
          if ((byte)((undefined1)local_248.typ - VNUM) < 4) {
            sVar12 = (&DAT_0081cf98)[(byte)((undefined1)local_248.typ - VNUM)];
          }
          else {
            sVar12 = 0;
          }
        }
        s_00.m_size = sVar12;
        s_00.m_data = (uchar *)&local_248;
        HexStr_abi_cxx11_((string *)local_2f8,s_00);
        ::UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_640,(string *)local_2f8);
        val.val._M_dataplus._M_p = (pointer)obj;
        val._0_8_ = in_stack_fffffffffffff918;
        val.val._M_string_length = (size_type)pvVar15;
        val.val.field_2._M_allocated_capacity = (size_type)pvVar16;
        val.val.field_2._8_8_ = pvVar17;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff948;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff94c;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff968;
        ::UniValue::push_back((UniValue *)local_1d0,val);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_640.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_640.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640.val._M_dataplus._M_p != &local_640.val.field_2) {
          operator_delete(local_640.val._M_dataplus._M_p,
                          local_640.val.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_) != local_2f8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2f8._4_4_,local_2f8._0_4_),
                          local_2f8._16_8_ + 1);
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x18;
      } while (uVar14 < ((long)pvVar16 - (long)pvVar15 >> 3) * -0x5555555555555555 - 1U);
    }
    local_660[0] = local_650;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"pubkeys","");
    pUVar8 = vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar7 = local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar6 = local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = local_1d0._16_8_;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._8_8_ == &local_1b8) {
      in_stack_fffffffffffff968 =
           CONCAT17(local_1b8._M_local_buf[0xf],
                    CONCAT25(local_1b8._13_2_,CONCAT41(local_1b8._9_4_,local_1b8._M_local_buf[8])));
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&stack0xfffffffffffff960;
    }
    uVar19._1_7_ = local_1b8._1_7_;
    uVar19._0_1_ = local_1b8._M_local_buf[0];
    local_1d0._16_8_ = 0;
    local_1b8._M_local_buf[0] = '\0';
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_190.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key_06._M_string_length = (size_type)obj;
    key_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff918;
    key_06.field_2._M_allocated_capacity = (size_type)pvVar15;
    key_06.field_2._8_8_ = pvVar16;
    val_07.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff940;
    val_07._0_8_ = pvVar17;
    val_07.val._M_string_length._0_4_ = local_1d0._0_4_;
    val_07.val._M_string_length._4_4_ = in_stack_fffffffffffff94c;
    val_07.val.field_2._M_allocated_capacity = (size_type)paVar18;
    val_07.val.field_2._8_8_ = uVar4;
    val_07.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar19;
    val_07.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff968;
    val_07.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar5;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pbVar6;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pbVar7;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar8;
    local_1d0._8_8_ = &local_1b8;
    ::UniValue::pushKV(obj,key_06,val_07);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffff988);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffff970);
    if (paVar18 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&stack0xfffffffffffff960) {
      operator_delete(paVar18,uVar19 + 1);
    }
    if (local_660[0] != local_650) {
      operator_delete(local_660[0],local_650[0] + 1);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_190);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._8_8_ == &local_1b8) goto LAB_0058ddf0;
  }
  operator_delete((void *)local_1d0._8_8_,CONCAT71(local_1b8._1_7_,local_1b8._M_local_buf[0]) + 1);
LAB_0058ddf0:
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_178._M_first);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&stack0xfffffffffffff928);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ProcessSubScript(const CScript& subscript, UniValue& obj) const
    {
        // Always present: script type and redeemscript
        std::vector<std::vector<unsigned char>> solutions_data;
        TxoutType which_type = Solver(subscript, solutions_data);
        obj.pushKV("script", GetTxnOutputType(which_type));
        obj.pushKV("hex", HexStr(subscript));

        CTxDestination embedded;
        if (ExtractDestination(subscript, embedded)) {
            // Only when the script corresponds to an address.
            UniValue subobj(UniValue::VOBJ);
            UniValue detail = DescribeAddress(embedded);
            subobj.pushKVs(std::move(detail));
            UniValue wallet_detail = std::visit(*this, embedded);
            subobj.pushKVs(std::move(wallet_detail));
            subobj.pushKV("address", EncodeDestination(embedded));
            subobj.pushKV("scriptPubKey", HexStr(subscript));
            // Always report the pubkey at the top level, so that `getnewaddress()['pubkey']` always works.
            if (subobj.exists("pubkey")) obj.pushKV("pubkey", subobj["pubkey"]);
            obj.pushKV("embedded", std::move(subobj));
        } else if (which_type == TxoutType::MULTISIG) {
            // Also report some information on multisig scripts (which do not have a corresponding address).
            obj.pushKV("sigsrequired", solutions_data[0][0]);
            UniValue pubkeys(UniValue::VARR);
            for (size_t i = 1; i < solutions_data.size() - 1; ++i) {
                CPubKey key(solutions_data[i].begin(), solutions_data[i].end());
                pubkeys.push_back(HexStr(key));
            }
            obj.pushKV("pubkeys", std::move(pubkeys));
        }
    }